

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall enact::SymbolExpr::~SymbolExpr(SymbolExpr *this)

{
  SymbolExpr *this_local;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__SymbolExpr_0016a7f8;
  Token::~Token(&this->name);
  Expr::~Expr(&this->super_Expr);
  return;
}

Assistant:

~SymbolExpr() override = default;